

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiDeviceInitializationTests.cpp
# Opt level: O2

TestStatus *
vkt::api::anon_unknown_1::createInstanceWithNullApplicationInfoTest
          (TestStatus *__return_storage_ptr__,Context *context)

{
  VkInstance_s *log;
  PlatformInterface *vk;
  qpTestResult qVar1;
  VkInstanceCreateInfo instanceCreateInfo;
  ResultCollector resultCollector;
  RefBase<vk::VkInstance_s_*> local_268 [2];
  VkInstanceCreateInfo local_238;
  undefined1 local_1f8 [80];
  undefined1 local_1a8 [8];
  DestroyInstanceFunc p_Stack_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [23];
  
  log = (VkInstance_s *)context->m_testCtx->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1a8,"",(allocator<char> *)&local_238);
  tcu::ResultCollector::ResultCollector
            ((ResultCollector *)local_1f8,(TestLog *)log,(string *)local_1a8);
  std::__cxx11::string::~string((string *)local_1a8);
  vk = context->m_platformInterface;
  local_238.pNext = (void *)0x0;
  local_238.enabledExtensionCount = 0;
  local_238._52_4_ = 0;
  local_238.ppEnabledExtensionNames = (char **)0x0;
  local_238.enabledLayerCount = 0;
  local_238._36_4_ = 0;
  local_238.ppEnabledLayerNames = (char **)0x0;
  local_238.flags = 0;
  local_238._20_4_ = 0;
  local_238.pApplicationInfo = (VkApplicationInfo *)0x0;
  local_238.sType = VK_STRUCTURE_TYPE_INSTANCE_CREATE_INFO;
  local_238._4_4_ = 0;
  local_1a8 = (undefined1  [8])log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&p_Stack_1a0);
  std::operator<<((ostream *)&p_Stack_1a0,"Creating instance with NULL pApplicationInfo");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&p_Stack_1a0);
  ::vk::createInstance
            ((Move<vk::VkInstance_s_*> *)local_1a8,vk,&local_238,(VkAllocationCallbacks *)0x0);
  local_268[0].m_data.deleter.m_allocator = (VkAllocationCallbacks *)local_198[0]._0_8_;
  local_268[0].m_data.object = (VkInstance_s *)local_1a8;
  local_268[0].m_data.deleter.m_destroyInstance = p_Stack_1a0;
  local_1a8 = (undefined1  [8])0x0;
  p_Stack_1a0 = (DestroyInstanceFunc)0x0;
  local_198[0]._M_allocated_capacity = 0;
  ::vk::refdetails::RefBase<vk::VkInstance_s_*>::~RefBase((RefBase<vk::VkInstance_s_*> *)local_1a8);
  local_1a8 = (undefined1  [8])log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&p_Stack_1a0);
  std::operator<<((ostream *)&p_Stack_1a0,"Succeeded");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&p_Stack_1a0);
  ::vk::refdetails::RefBase<vk::VkInstance_s_*>::~RefBase(local_268);
  qVar1 = tcu::ResultCollector::getResult((ResultCollector *)local_1f8);
  std::__cxx11::string::string((string *)local_1a8,(string *)(local_1f8 + 0x30));
  __return_storage_ptr__->m_code = qVar1;
  std::__cxx11::string::string((string *)&__return_storage_ptr__->m_description,(string *)local_1a8)
  ;
  std::__cxx11::string::~string((string *)local_1a8);
  tcu::ResultCollector::~ResultCollector((ResultCollector *)local_1f8);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createInstanceWithNullApplicationInfoTest (Context& context)
{
	tcu::TestLog&				log						= context.getTestContext().getLog();
	tcu::ResultCollector		resultCollector			(log);
	const PlatformInterface&	platformInterface		= context.getPlatformInterface();

	const VkInstanceCreateInfo		instanceCreateInfo		=
	{
		VK_STRUCTURE_TYPE_INSTANCE_CREATE_INFO,	// VkStructureType				sType;
		DE_NULL,								// const void*					pNext;
		(VkInstanceCreateFlags)0u,				// VkInstanceCreateFlags		flags;
		DE_NULL,								// const VkApplicationInfo*		pAppInfo;
		0u,										// deUint32						layerCount;
		DE_NULL,								// const char*const*			ppEnabledLayernames;
		0u,										// deUint32						extensionCount;
		DE_NULL,								// const char*const*			ppEnabledExtensionNames;
	};

	log << TestLog::Message << "Creating instance with NULL pApplicationInfo" << TestLog::EndMessage;

	try
	{
		const Unique<VkInstance> instance(createInstance(platformInterface, &instanceCreateInfo));
		log << TestLog::Message << "Succeeded" << TestLog::EndMessage;
	}
	catch (const vk::Error& err)
	{
		resultCollector.fail("Failed, Error code: " + de::toString(err.getMessage()));
	}

	return tcu::TestStatus(resultCollector.getResult(), resultCollector.getMessage());
}